

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor-read.c
# Opt level: O3

int coda_cursor_read_float_partial_array(coda_cursor *cursor,long offset,long length,float *dst)

{
  int iVar1;
  long in_RAX;
  coda_type *base_type;
  double *dst_00;
  char *pcVar2;
  undefined8 uVar3;
  ulong uVar4;
  char *message;
  coda_type *pcVar5;
  long in_FS_OFFSET;
  long num_elements;
  long local_38;
  
  if (((cursor == (coda_cursor *)0x0) || (cursor->n < 1)) ||
     (pcVar5 = (coda_type *)cursor->stack[cursor->n - 1].type, pcVar5 == (coda_type *)0x0)) {
    pcVar2 = "invalid cursor argument (%s:%u)";
    uVar3 = 0x13f1;
LAB_0014d0b7:
    coda_set_error(-100,pcVar2,
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor-read.c"
                   ,uVar3);
    return -1;
  }
  if (dst == (float *)0x0) {
    pcVar2 = "dst argument is NULL (%s:%u)";
    uVar3 = 0x13f6;
    goto LAB_0014d0b7;
  }
  if (99 < pcVar5->format) {
    pcVar5 = *(coda_type **)&pcVar5->type_class;
  }
  if (pcVar5->type_class != coda_array_class) {
    pcVar2 = coda_type_get_class_name(pcVar5->type_class);
    message = "cursor does not refer to an array (current type is %s)";
LAB_0014d0fa:
    coda_set_error(-0x69,message,pcVar2);
    return -1;
  }
  if (*(int *)(in_FS_OFFSET + -0x1208) != 0) {
    local_38 = in_RAX;
    iVar1 = coda_cursor_get_num_elements(cursor,&local_38);
    if (iVar1 != 0) {
      return -1;
    }
    if (offset < 0 || local_38 <= offset) {
      coda_set_error(-0x6b,"array offset (%ld) exceeds array range [0:%ld)",offset,local_38);
      return -1;
    }
    if (local_38 < length + offset) {
      coda_set_error(-0x6b,"array offset (%ld) + length (%ld) exceeds array range [0:%ld)",offset,
                     length);
      return -1;
    }
  }
  pcVar5 = *(coda_type **)(pcVar5 + 1);
  if (((pcVar5->type_class == coda_integer_class) || (pcVar5->type_class == coda_real_class)) &&
     ((*(int *)(in_FS_OFFSET + -0x1204) != 0 && (pcVar5[1].name != (char *)0x0)))) {
    dst_00 = (double *)malloc(length * 8);
    if (dst_00 == (double *)0x0) goto LAB_0014d4d4;
    iVar1 = coda_cursor_read_double_partial_array(cursor,offset,length,dst_00);
    if (iVar1 != 0) goto LAB_0014d168;
    if (0 < length) {
      uVar4 = length + 1;
      do {
        dst[uVar4 - 2] = (float)dst_00[uVar4 - 2];
        uVar4 = uVar4 - 1;
      } while (1 < uVar4);
    }
    goto LAB_0014d215;
  }
  switch(pcVar5->read_type) {
  case coda_native_type_int8:
    iVar1 = read_int8_partial_array(cursor,offset,length,(int8_t *)dst);
    if (iVar1 != 0) {
      return -1;
    }
    if (0 < length) {
      uVar4 = length + 1;
      do {
        dst[uVar4 - 2] = (float)(int)*(char *)((long)dst + (uVar4 - 2));
        uVar4 = uVar4 - 1;
      } while (1 < uVar4);
    }
    break;
  case coda_native_type_uint8:
    iVar1 = read_uint8_partial_array(cursor,offset,length,(uint8_t *)dst);
    if (iVar1 != 0) {
      return -1;
    }
    if (0 < length) {
      uVar4 = length + 1;
      do {
        dst[uVar4 - 2] = (float)*(byte *)((long)dst + (uVar4 - 2));
        uVar4 = uVar4 - 1;
      } while (1 < uVar4);
    }
    break;
  case coda_native_type_int16:
    iVar1 = read_int16_partial_array(cursor,offset,length,(int16_t *)dst);
    if (iVar1 != 0) {
      return -1;
    }
    if (0 < length) {
      uVar4 = length + 1;
      do {
        dst[uVar4 - 2] = (float)(int)*(short *)((long)dst + uVar4 * 2 + -4);
        uVar4 = uVar4 - 1;
      } while (1 < uVar4);
    }
    break;
  case coda_native_type_uint16:
    iVar1 = read_uint16_partial_array(cursor,offset,length,(uint16_t *)dst);
    if (iVar1 != 0) {
      return -1;
    }
    if (0 < length) {
      uVar4 = length + 1;
      do {
        dst[uVar4 - 2] = (float)*(ushort *)((long)dst + uVar4 * 2 + -4);
        uVar4 = uVar4 - 1;
      } while (1 < uVar4);
    }
    break;
  case coda_native_type_int32:
    iVar1 = read_int32_partial_array(cursor,offset,length,(int32_t *)dst);
    if (iVar1 != 0) {
      return -1;
    }
    if (0 < length) {
      uVar4 = length + 1;
      do {
        dst[uVar4 - 2] = (float)(int)dst[uVar4 - 2];
        uVar4 = uVar4 - 1;
      } while (1 < uVar4);
    }
    break;
  case coda_native_type_uint32:
    iVar1 = read_uint32_partial_array(cursor,offset,length,(uint32_t *)dst);
    if (iVar1 != 0) {
      return -1;
    }
    if (0 < length) {
      uVar4 = length + 1;
      do {
        dst[uVar4 - 2] = (float)(uint)dst[uVar4 - 2];
        uVar4 = uVar4 - 1;
      } while (1 < uVar4);
    }
    break;
  case coda_native_type_int64:
    dst_00 = (double *)malloc(length * 8);
    if (dst_00 == (double *)0x0) {
LAB_0014d4d4:
      coda_set_error(-1,"out of memory (could not allocate %lu bytes)",length * 8);
      return -1;
    }
    iVar1 = read_int64_partial_array(cursor,offset,length,(int64_t *)dst_00);
    if (iVar1 != 0) {
LAB_0014d168:
      free(dst_00);
      return -1;
    }
    if (0 < length) {
      uVar4 = length + 1;
      do {
        dst[uVar4 - 2] = (float)(long)dst_00[uVar4 - 2];
        uVar4 = uVar4 - 1;
      } while (1 < uVar4);
    }
    goto LAB_0014d215;
  case coda_native_type_uint64:
    dst_00 = (double *)malloc(length * 8);
    if (dst_00 == (double *)0x0) goto LAB_0014d4d4;
    iVar1 = read_uint64_partial_array(cursor,offset,length,(uint64_t *)dst_00);
    if (iVar1 != 0) goto LAB_0014d168;
    if (0 < length) {
      uVar4 = length + 1;
      do {
        dst[uVar4 - 2] = (float)(ulong)dst_00[uVar4 - 2];
        uVar4 = uVar4 - 1;
      } while (1 < uVar4);
    }
    goto LAB_0014d215;
  case coda_native_type_float:
    iVar1 = read_float_partial_array(cursor,offset,length,dst);
    if (iVar1 != 0) {
      return -1;
    }
    break;
  case coda_native_type_double:
    dst_00 = (double *)malloc(length * 8);
    if (dst_00 == (double *)0x0) goto LAB_0014d4d4;
    iVar1 = read_double_partial_array(cursor,offset,length,dst_00);
    if (iVar1 != 0) goto LAB_0014d168;
    if (0 < length) {
      uVar4 = length + 1;
      do {
        dst[uVar4 - 2] = (float)dst_00[uVar4 - 2];
        uVar4 = uVar4 - 1;
      } while (1 < uVar4);
    }
LAB_0014d215:
    free(dst_00);
    break;
  default:
    pcVar2 = coda_type_get_native_type_name(pcVar5->read_type);
    message = "can not read %s data using a float data type";
    goto LAB_0014d0fa;
  }
  return 0;
}

Assistant:

LIBCODA_API int coda_cursor_read_float_partial_array(const coda_cursor *cursor, long offset, long length, float *dst)
{
    coda_native_type read_type;
    coda_conversion *conversion;
    coda_type *type;
    long i;

    if (cursor == NULL || cursor->n <= 0 || cursor->stack[cursor->n - 1].type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid cursor argument (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (dst == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "dst argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    type = coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);
    if (type->type_class != coda_array_class)
    {
        coda_set_error(CODA_ERROR_INVALID_TYPE, "cursor does not refer to an array (current type is %s)",
                       coda_type_get_class_name(type->type_class));
        return -1;
    }

    /* check the range for offset and length */
    if (coda_option_perform_boundary_checks)
    {
        long num_elements;

        if (coda_cursor_get_num_elements(cursor, &num_elements) != 0)
        {
            return -1;
        }
        if (offset < 0 || offset >= num_elements)
        {
            coda_set_error(CODA_ERROR_ARRAY_OUT_OF_BOUNDS, "array offset (%ld) exceeds array range [0:%ld)", offset,
                           num_elements);
            return -1;
        }
        if (offset + length > num_elements)
        {
            coda_set_error(CODA_ERROR_ARRAY_OUT_OF_BOUNDS, "array offset (%ld) + length (%ld) exceeds array range "
                           "[0:%ld)", offset, length, num_elements);
            return -1;
        }
    }

    if (get_array_element_unconverted_read_type(type, &read_type, &conversion) != 0)
    {
        return -1;
    }
    if (conversion != NULL)
    {
        double *array;

        /* let the conversion be performed by coda_cursor_read_double_array() and cast the result */
        array = malloc(length * sizeof(double));
        if (array == NULL)
        {
            coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes)",
                           length * sizeof(double));
            return -1;
        }
        if (coda_cursor_read_double_partial_array(cursor, offset, length, array) != 0)
        {
            free(array);
            return -1;
        }
        for (i = length - 1; i >= 0; i--)
        {
            dst[i] = (float)array[i];
        }
        free(array);
        return 0;
    }
    switch (read_type)
    {
        case coda_native_type_int8:
            if (read_int8_partial_array(cursor, offset, length, (int8_t *)dst) != 0)
            {
                return -1;
            }
            for (i = length - 1; i >= 0; i--)
            {
                dst[i] = (float)((int8_t *)dst)[i];
            }
            break;
        case coda_native_type_uint8:
            if (read_uint8_partial_array(cursor, offset, length, (uint8_t *)dst) != 0)
            {
                return -1;
            }
            for (i = length - 1; i >= 0; i--)
            {
                dst[i] = (float)((uint8_t *)dst)[i];
            }
            break;
        case coda_native_type_int16:
            if (read_int16_partial_array(cursor, offset, length, (int16_t *)dst) != 0)
            {
                return -1;
            }
            for (i = length - 1; i >= 0; i--)
            {
                dst[i] = (float)((int16_t *)dst)[i];
            }
            break;
        case coda_native_type_uint16:
            if (read_uint16_partial_array(cursor, offset, length, (uint16_t *)dst) != 0)
            {
                return -1;
            }
            for (i = length - 1; i >= 0; i--)
            {
                dst[i] = (float)((uint16_t *)dst)[i];
            }
            break;
        case coda_native_type_int32:
            if (read_int32_partial_array(cursor, offset, length, (int32_t *)dst) != 0)
            {
                return -1;
            }
            for (i = length - 1; i >= 0; i--)
            {
                dst[i] = (float)((int32_t *)dst)[i];
            }
            break;
        case coda_native_type_uint32:
            if (read_uint32_partial_array(cursor, offset, length, (uint32_t *)dst) != 0)
            {
                return -1;
            }
            for (i = length - 1; i >= 0; i--)
            {
                dst[i] = (float)((uint32_t *)dst)[i];
            }
            break;
        case coda_native_type_int64:
            {
                int64_t *array;

                array = malloc(length * sizeof(int64_t));
                if (array == NULL)
                {
                    coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes)",
                                   length * sizeof(int64_t));
                    return -1;
                }
                if (read_int64_partial_array(cursor, offset, length, array) != 0)
                {
                    free(array);
                    return -1;
                }
                for (i = length - 1; i >= 0; i--)
                {
                    dst[i] = (float)array[i];
                }
                free(array);
            }
            break;
        case coda_native_type_uint64:
            {
                uint64_t *array;

                array = malloc(length * sizeof(uint64_t));
                if (array == NULL)
                {
                    coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes)",
                                   length * sizeof(int64_t));
                    return -1;
                }
                if (read_uint64_partial_array(cursor, offset, length, array) != 0)
                {
                    free(array);
                    return -1;
                }
                for (i = length - 1; i >= 0; i--)
                {
                    dst[i] = (float)array[i];
                }
                free(array);
            }
            break;
        case coda_native_type_float:
            if (read_float_partial_array(cursor, offset, length, dst) != 0)
            {
                return -1;
            }
            break;
        case coda_native_type_double:
            {
                double *array;

                array = malloc(length * sizeof(double));
                if (array == NULL)
                {
                    coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes)",
                                   length * sizeof(double));
                    return -1;
                }
                if (read_double_partial_array(cursor, offset, length, array) != 0)
                {
                    free(array);
                    return -1;
                }
                for (i = length - 1; i >= 0; i--)
                {
                    dst[i] = (float)array[i];
                }
                free(array);
            }
            break;
        default:
            coda_set_error(CODA_ERROR_INVALID_TYPE, "can not read %s data using a float data type",
                           coda_type_get_native_type_name(read_type));
            return -1;
    }

    return 0;
}